

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

void duckdb_je_hpa_shard_destroy(tsdn_t *tsdn,hpa_shard_t *shard)

{
  psset_t *psset;
  hpdata_t *ps;
  
  psset = &shard->psset;
  ps = duckdb_je_psset_pick_alloc(psset,0x1000);
  while (ps != (hpdata_t *)0x0) {
    duckdb_je_psset_remove(psset,ps);
    (*(shard->central->hooks).unmap)(ps->h_address,0x200000);
    ps = duckdb_je_psset_pick_alloc(psset,0x1000);
  }
  return;
}

Assistant:

void
hpa_shard_destroy(tsdn_t *tsdn, hpa_shard_t *shard) {
	hpa_do_consistency_checks(shard);
	/*
	 * By the time we're here, the arena code should have dalloc'd all the
	 * active extents, which means we should have eventually evicted
	 * everything from the psset, so it shouldn't be able to serve even a
	 * 1-page allocation.
	 */
	if (config_debug) {
		malloc_mutex_lock(tsdn, &shard->mtx);
		hpa_assert_empty(tsdn, shard, &shard->psset);
		malloc_mutex_unlock(tsdn, &shard->mtx);
	}
	hpdata_t *ps;
	while ((ps = psset_pick_alloc(&shard->psset, PAGE)) != NULL) {
		/* There should be no allocations anywhere. */
		assert(hpdata_empty(ps));
		psset_remove(&shard->psset, ps);
		shard->central->hooks.unmap(hpdata_addr_get(ps), HUGEPAGE);
	}
}